

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  ImGuiID IVar2;
  short sVar3;
  ImU32 IVar4;
  int iVar5;
  uint uVar6;
  ImGuiWindow *pIVar7;
  ImGuiTabItem *pIVar8;
  ImDrawList *draw_list;
  uint3 uVar9;
  ImGuiIO *pIVar10;
  ImGuiIO *pIVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  ImS8 IVar16;
  undefined4 uVar17;
  ImU32 col;
  ImGuiID IVar18;
  bool *pbVar19;
  ulong uVar20;
  ImGuiTabItem *__dest;
  size_t sVar21;
  char *pcVar22;
  int iVar23;
  int iVar24;
  ImGuiContext *pIVar25;
  ImGuiCol idx;
  ulong uVar26;
  ImGuiContext *pIVar27;
  uint uVar28;
  bool bVar29;
  uint uVar30;
  float fVar31;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar32;
  float fVar33;
  bool text_clipped;
  bool just_closed;
  uint local_b0;
  ImU32 local_ac;
  ImRect bb;
  bool hovered;
  undefined7 uStack_77;
  float fStack_74;
  bool held;
  float local_6c;
  ImGuiContext *local_68;
  int local_5c;
  undefined1 local_58 [16];
  ImVec2 local_48;
  char *local_40;
  ImGuiContext *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar25 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  if (pIVar7->SkipItems != false) {
    return false;
  }
  local_ac = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,local_ac,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  local_68 = pIVar25;
  pbVar19 = (bool *)0x0;
  uVar28 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    pbVar19 = p_open;
    uVar28 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar28 = flags;
  }
  local_40 = label;
  IVar32 = TabItemCalcSize(label,pbVar19 != (bool *)0x0);
  fVar33 = IVar32.x;
  if (local_ac == 0) {
LAB_00153d70:
    pIVar25 = (ImGuiContext *)0x0;
  }
  else {
    uVar20 = (ulong)(tab_bar->Tabs).Size;
    bVar29 = 0 < (long)uVar20;
    if (0 < (long)uVar20) {
      pIVar25 = (ImGuiContext *)(tab_bar->Tabs).Data;
      bVar29 = true;
      IVar4._0_1_ = pIVar25->Initialized;
      IVar4._1_1_ = pIVar25->FontAtlasOwnedByContext;
      IVar4._2_2_ = *(undefined2 *)&pIVar25->field_0x2;
      if (IVar4 != local_ac) {
        pIVar10 = &pIVar25->IO;
        uVar13 = 1;
        pIVar27 = pIVar25;
        do {
          uVar26 = uVar13;
          pIVar25 = (ImGuiContext *)(pIVar10->KeyMap + uVar20 * 9 + -0x18);
          if (uVar20 == uVar26) break;
          pIVar25 = (ImGuiContext *)((long)&(pIVar27->IO).IniFilename + 4);
          pIVar11 = &pIVar27->IO;
          uVar13 = uVar26 + 1;
          pIVar27 = pIVar25;
        } while (*(ImU32 *)((long)&pIVar11->IniFilename + 4) != local_ac);
        bVar29 = uVar26 < uVar20;
      }
    }
    if (!bVar29) goto LAB_00153d70;
  }
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_4_ = IVar32.x;
  local_58._4_4_ = IVar32.y;
  local_58._12_4_ = extraout_XMM0_Dd;
  local_38 = pIVar25;
  if (pIVar25 == (ImGuiContext *)0x0) {
    iVar24 = (tab_bar->Tabs).Size;
    iVar5 = (tab_bar->Tabs).Capacity;
    if (iVar24 == iVar5) {
      iVar24 = iVar24 + 1;
      if (iVar5 == 0) {
        iVar23 = 8;
      }
      else {
        iVar23 = iVar5 / 2 + iVar5;
      }
      if (iVar24 < iVar23) {
        iVar24 = iVar23;
      }
      if (iVar5 < iVar24) {
        __dest = (ImGuiTabItem *)MemAlloc((long)iVar24 * 0x24);
        pIVar8 = (tab_bar->Tabs).Data;
        if (pIVar8 != (ImGuiTabItem *)0x0) {
          memcpy(__dest,pIVar8,(long)(tab_bar->Tabs).Size * 0x24);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = __dest;
        (tab_bar->Tabs).Capacity = iVar24;
        fVar33 = (float)local_58._0_4_;
      }
    }
    pIVar8 = (tab_bar->Tabs).Data;
    iVar24 = (tab_bar->Tabs).Size;
    pIVar8[iVar24].ID = 0;
    pIVar8[iVar24].Flags = 0;
    pIVar8[iVar24].LastFrameVisible = -1;
    pIVar8[iVar24].LastFrameSelected = -1;
    pIVar8[iVar24].Offset = 0.0;
    pIVar8[iVar24].Width = 0.0;
    pIVar8[iVar24].ContentWidth = 0.0;
    pIVar8 = pIVar8 + iVar24;
    pIVar8->NameOffset = -1;
    pIVar8->BeginOrder = -1;
    pIVar8->IndexDuringLayout = -1;
    pIVar8->WantClose = false;
    pIVar8->field_0x23 = 0;
    iVar24 = (tab_bar->Tabs).Size;
    (tab_bar->Tabs).Size = iVar24 + 1;
    pIVar8 = (tab_bar->Tabs).Data;
    local_38 = (ImGuiContext *)(pIVar8 + iVar24);
    local_38->Initialized = (bool)(undefined1)local_ac;
    local_38->FontAtlasOwnedByContext = (bool)local_ac._1_1_;
    *(undefined2 *)&local_38->field_0x2 = local_ac._2_2_;
    pIVar8[iVar24].Width = fVar33;
    tab_bar->TabsAddedNew = true;
  }
  pcVar12 = local_40;
  tab_bar->LastTabItemIdx =
       (short)((uint)((int)local_38 - *(int *)&(tab_bar->Tabs).Data) >> 2) * -0x71c7;
  (local_38->IO).DeltaTime = fVar33;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  uVar30 = uVar28 | 0x100000;
  if (pbVar19 != (bool *)0x0) {
    uVar30 = uVar28;
  }
  *(short *)((long)&(local_38->IO).IniSavingRate + 2) = sVar3;
  uVar28 = tab_bar->Flags;
  local_b0 = tab_bar->PrevFrameVisible + 1;
  iVar24 = local_68->FrameCount;
  iVar23 = (local_38->IO).ConfigFlags + 1;
  (local_38->IO).ConfigFlags = iVar24;
  *(uint *)&local_38->field_0x4 = uVar30;
  iVar5 = (tab_bar->TabsNames).Buf.Size;
  sVar3 = (short)iVar5 + -1;
  if (iVar5 == 0) {
    sVar3 = 0;
  }
  *(short *)&(local_38->IO).IniSavingRate = sVar3;
  sVar21 = strlen(local_40);
  IVar4 = local_ac;
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar12,pcVar12 + sVar21 + 1);
  pIVar27 = local_38;
  if (((iVar23 < iVar24) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if ((int)local_b0 < iVar24) {
      if ((uVar30 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_00153f3e;
    }
    else if ((uVar30 >> 0x15 & 1) == 0) {
LAB_00153f3e:
      tab_bar->NextSelectedTabId = IVar4;
    }
  }
  if ((((uVar30 & 2) != 0) && (tab_bar->SelectedTabId != IVar4)) && ((uVar30 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = IVar4;
  }
  if (tab_bar->VisibleTabId == IVar4) {
    tab_bar->VisibleTabWasSubmitted = true;
    bVar29 = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && (int)local_b0 < iVar24) && ((tab_bar->Tabs).Size == 1)) {
    bVar29 = (tab_bar->Flags & 2) == 0;
  }
  else {
    bVar29 = false;
  }
  if ((iVar23 < iVar24) && (pIVar25 == (ImGuiContext *)0x0 || iVar24 <= (int)local_b0)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,IVar4,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((uVar30 >> 0x15 & 1) == 0 & bVar29);
  }
  if (tab_bar->SelectedTabId == IVar4) {
    (local_38->IO).BackendFlags = local_68->FrameCount;
  }
  uVar6 = *(uint *)&local_38->field_0x4;
  fVar33 = (local_38->IO).DisplaySize.y;
  fVar31 = (local_38->IO).DisplaySize.x;
  if ((uVar6 & 0xc0) == 0) {
    fVar31 = (float)(int)(fVar31 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar31 + (tab_bar->BarRect).Min.x;
  local_48 = (pIVar7->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar32.y = bb.Min.y;
  IVar32.x = bb.Min.x;
  (pIVar7->DC).CursorPos = IVar32;
  fVar33 = fVar33 + bb.Min.x;
  fVar31 = (float)local_58._4_4_ + bb.Min.y;
  bb.Max.y = fVar31;
  bb.Max.x = fVar33;
  if ((uVar6 & 0xc0) == 0) {
    uVar9 = (uint3)(uVar6 >> 8);
    uVar17 = (undefined4)CONCAT71((uint7)uVar9,1);
    if (tab_bar->ScrollingRectMinX <= bb.Min.x) {
      uVar17 = CONCAT31(uVar9,tab_bar->ScrollingRectMaxX <= fVar33 &&
                              fVar33 != tab_bar->ScrollingRectMaxX);
    }
  }
  else {
    uVar17 = 0;
  }
  local_58._0_4_ = uVar17;
  local_b0 = uVar30;
  local_5c = iVar23;
  if ((char)uVar17 != '\0') {
    uVar30 = -(uint)(tab_bar->ScrollingRectMinX <= bb.Min.x);
    fStack_74 = bb.Min.y + -1.0;
    _hovered = (float)(~uVar30 & (uint)tab_bar->ScrollingRectMinX | (uint)bb.Min.x & uVar30);
    _held = tab_bar->ScrollingRectMaxX;
    local_6c = fVar31;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
  }
  pIVar25 = local_68;
  IVar32 = (pIVar7->DC).CursorMaxPos;
  fStack_74 = bb.Max.y - bb.Min.y;
  _hovered = bb.Max.x - bb.Min.x;
  ItemSize((ImVec2 *)&hovered,(local_68->Style).FramePadding.y);
  (pIVar7->DC).CursorMaxPos = IVar32;
  bVar14 = ItemAdd(&bb,IVar4,(ImRect *)0x0);
  if (!bVar14) {
    if (local_58[0] != '\0') {
      PopClipRect();
    }
    (pIVar7->DC).CursorPos = local_48;
    return bVar29;
  }
  uVar30 = local_b0 & 0x200000;
  bVar14 = ButtonBehavior(&bb,IVar4,&hovered,&held,
                          (uVar30 >> 0x11) + (uint)pIVar25->DragDropActive * 0x200 + 0x1010);
  if ((bVar14) && (uVar30 == 0)) {
    tab_bar->NextSelectedTabId = IVar4;
  }
  hovered = (bool)(hovered | pIVar25->HoveredId == IVar4);
  if (pIVar25->ActiveId != IVar4) {
    SetItemAllowOverlap();
  }
  uVar6 = local_b0;
  if ((((held == true) && (iVar24 <= local_5c)) && (bVar15 = IsMouseDragging(0,-1.0), bVar15)) &&
     ((pIVar25->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) {
    fVar33 = (pIVar25->IO).MouseDelta.x;
    if (fVar33 < 0.0) {
      IVar16 = -1;
      pIVar1 = &(pIVar25->IO).MousePos;
      if (bb.Min.x < pIVar1->x || bb.Min.x == pIVar1->x) goto LAB_00154239;
LAB_0015424f:
      tab_bar->ReorderRequestTabId = *(ImGuiID *)pIVar27;
      tab_bar->ReorderRequestDir = IVar16;
    }
    else {
LAB_00154239:
      if (0.0 < fVar33) {
        IVar16 = '\x01';
        if (bb.Max.x < (pIVar25->IO).MousePos.x) goto LAB_0015424f;
      }
    }
  }
  draw_list = pIVar7->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (bVar29 == false) {
      idx = (uint)((uVar28 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar28 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,uVar6,col);
  RenderNavHighlight(&bb,IVar4,1);
  bVar15 = IsItemHovered(8);
  if (bVar15) {
    bVar15 = IsMouseClicked(1,false);
    if (bVar15) {
      uVar30 = uVar6 >> 0x15 & 1;
    }
    else {
      bVar15 = IsMouseReleased(1);
      if (!bVar15) goto LAB_00154341;
    }
    if (uVar30 == 0) {
      tab_bar->NextSelectedTabId = IVar4;
    }
  }
LAB_00154341:
  uVar28 = tab_bar->Flags;
  if (pbVar19 == (bool *)0x0) {
    IVar18 = 0;
  }
  else {
    IVar18 = GetIDWithSeed("#CLOSE",(char *)0x0,IVar4);
  }
  pcVar12 = local_40;
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar28 >> 1 & 4 | uVar6,tab_bar->FramePadding,local_40,IVar4,IVar18,
             bVar29,&just_closed,&text_clipped);
  IVar32 = local_48;
  if ((pbVar19 != (bool *)0x0) && (just_closed != false)) {
    *pbVar19 = false;
    if ((pIVar27->field_0x4 & 1) == 0) {
      *(undefined1 *)((long)&(pIVar27->IO).IniFilename + 2) = 1;
      IVar2._0_1_ = pIVar27->Initialized;
      IVar2._1_1_ = pIVar27->FontAtlasOwnedByContext;
      IVar2._2_2_ = *(undefined2 *)&pIVar27->field_0x2;
      if (tab_bar->VisibleTabId == IVar2) {
        (pIVar27->IO).ConfigFlags = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else {
      IVar18._0_1_ = pIVar27->Initialized;
      IVar18._1_1_ = pIVar27->FontAtlasOwnedByContext;
      IVar18._2_2_ = *(undefined2 *)&pIVar27->field_0x2;
      if (tab_bar->VisibleTabId != IVar18) {
        tab_bar->NextSelectedTabId = IVar18;
      }
    }
  }
  if (local_58[0] != '\0') {
    PopClipRect();
  }
  (pIVar7->DC).CursorPos = IVar32;
  if ((((text_clipped == true) && (pIVar25->HoveredId == local_ac)) && (held == false)) &&
     (((pIVar25->TooltipSlowDelay <= pIVar25->HoveredIdNotActiveTimer &&
        pIVar25->HoveredIdNotActiveTimer != pIVar25->TooltipSlowDelay &&
       (bVar15 = IsItemHovered(0), bVar15)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar27->field_0x4 & 0x10) == 0)))))) {
    pcVar22 = FindRenderedTextEnd(pcVar12,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar22 - (int)pcVar12),pcVar12);
  }
  if ((local_b0 >> 0x15 & 1) == 0) {
    bVar14 = bVar29;
  }
  return bVar14;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}